

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveLright2(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *vec,int *ridx,int *rn,
               number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *eps,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *vec2,int *ridx2,int *rn2,
               number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *eps2)

{
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  bool bVar2;
  long in_RSI;
  int *in_RDI;
  cpp_dec_float<100U,_int,_void> *in_R8;
  long in_R9;
  StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  tmp2;
  StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  tmp1;
  int *lbeg;
  int *idx;
  int *lidx;
  int *lrow;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *val;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *lval;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  int end;
  int n;
  int k;
  int j;
  int i;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_5;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_5;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_4;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_4;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffff558;
  int *in_stack_fffffffffffff578;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff580;
  int in_stack_fffffffffffff58c;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff590;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff598;
  undefined1 local_a38 [48];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff5f8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff600;
  undefined1 local_9e8 [80];
  undefined1 local_998 [80];
  undefined1 local_948 [80];
  undefined1 local_8f8 [80];
  undefined1 local_8a8 [80];
  undefined1 local_858 [80];
  undefined1 local_808 [80];
  undefined1 local_7b8 [240];
  undefined1 local_6c8 [80];
  undefined1 local_678 [80];
  undefined1 local_628 [80];
  undefined1 local_5d8 [80];
  undefined1 local_588 [80];
  undefined1 local_538 [80];
  undefined1 local_4e8 [80];
  undefined1 local_498 [80];
  undefined1 local_448 [80];
  undefined1 local_3f8 [80];
  long local_3a8;
  int *local_3a0;
  long local_398;
  long local_390;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_388;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_380;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_374;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_324;
  int local_2d4;
  undefined4 local_2d0;
  int local_2cc;
  int local_2c8;
  int local_2c4;
  long local_2c0;
  long local_2a0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_290;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_288;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_280;
  undefined1 *local_278;
  undefined1 *local_268;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_260;
  undefined1 *local_258;
  undefined1 *local_248;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_240;
  undefined1 *local_238;
  undefined1 *local_228;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_220;
  undefined1 *local_218;
  undefined1 *local_208;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_200;
  undefined1 *local_1f8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1b8;
  undefined1 *local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1a8;
  long local_1a0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_198;
  long local_190;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_188;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_179;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_178;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_158;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_150;
  undefined1 *local_148;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_139;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_138;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_118;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_110;
  undefined1 *local_108;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_f9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d0;
  undefined1 *local_c8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_b9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_98;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_90;
  undefined1 *local_88;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_79;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_50;
  undefined1 *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  local_290 = &local_324;
  local_2c0 = in_R9;
  local_2a0 = in_RSI;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(in_R8);
  local_288 = &local_374;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(in_R8);
  local_380 = std::
              vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ::data((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      *)0x546815);
  local_398 = *(long *)(in_RDI + 0x78);
  local_390 = *(long *)(in_RDI + 0x80);
  local_3a8 = *(long *)(in_RDI + 0x7e);
  local_2d4 = in_RDI[0x7b];
  for (local_2c4 = 0; local_2c4 < local_2d4; local_2c4 = local_2c4 + 1) {
    local_2c8 = *(int *)(local_390 + (long)local_2c4 * 4);
    local_190 = local_2c0 + (long)local_2c8 * 0x50;
    local_188 = &local_374;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              (in_R8,in_stack_fffffffffffff558);
    local_1a0 = local_2a0 + (long)local_2c8 * 0x50;
    local_198 = &local_324;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              (in_R8,in_stack_fffffffffffff558);
    local_278 = local_3f8;
    local_280 = &local_324;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              (in_R8,in_stack_fffffffffffff558);
    local_268 = local_448;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              (in_R8,in_stack_fffffffffffff558);
    bVar2 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8);
    if (bVar2) {
      local_2cc = *(int *)(local_3a8 + (long)local_2c4 * 4);
      local_3a0 = (int *)(local_398 + (long)local_2cc * 4);
      local_388 = local_380 + local_2cc;
      local_258 = local_498;
      local_260 = &local_374;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                (in_R8,in_stack_fffffffffffff558);
      local_248 = local_4e8;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                (in_R8,in_stack_fffffffffffff558);
      bVar2 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8);
      if (bVar2) {
        for (local_2c8 = *(int *)(local_3a8 + (long)(local_2c4 + 1) * 4); local_2cc < local_2c8;
            local_2c8 = local_2c8 + -1) {
          local_2d0 = *local_3a0;
          local_28 = local_538;
          local_30 = &local_324;
          local_38 = local_388;
          local_3a0 = local_3a0 + 1;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_39,local_30,local_388);
          local_20 = local_538;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(in_R8);
          local_8 = local_538;
          local_10 = local_30;
          local_18 = local_38;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (in_R8,in_stack_fffffffffffff558,(cpp_dec_float<100U,_int,_void> *)0x546b8c);
          updateSolutionVectorLright
                    (in_stack_fffffffffffff598,in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
                     in_stack_fffffffffffff580,in_stack_fffffffffffff578,in_RDI);
          local_68 = local_588;
          local_70 = &local_374;
          local_78 = local_388;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_79,local_70,local_388);
          local_60 = local_588;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(in_R8);
          local_48 = local_588;
          local_50 = local_70;
          local_58 = local_78;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (in_R8,in_stack_fffffffffffff558,(cpp_dec_float<100U,_int,_void> *)0x546c83);
          updateSolutionVectorLright
                    (in_stack_fffffffffffff598,in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
                     in_stack_fffffffffffff580,in_stack_fffffffffffff578,in_RDI);
          local_388 = local_388 + 1;
        }
      }
      else {
        for (local_2c8 = *(int *)(local_3a8 + (long)(local_2c4 + 1) * 4); local_2cc < local_2c8;
            local_2c8 = local_2c8 + -1) {
          local_2d0 = *local_3a0;
          local_a8 = local_5d8;
          local_b0 = &local_324;
          local_b8 = local_388;
          local_3a0 = local_3a0 + 1;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_b9,local_b0,local_388);
          local_a0 = local_5d8;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(in_R8);
          local_88 = local_5d8;
          local_90 = local_b0;
          local_98 = local_b8;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (in_R8,in_stack_fffffffffffff558,(cpp_dec_float<100U,_int,_void> *)0x546dfc);
          updateSolutionVectorLright
                    (in_stack_fffffffffffff598,in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
                     in_stack_fffffffffffff580,in_stack_fffffffffffff578,in_RDI);
          local_388 = local_388 + 1;
        }
      }
    }
    else {
      local_238 = local_628;
      local_240 = &local_374;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                (in_R8,in_stack_fffffffffffff558);
      local_228 = local_678;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                (in_R8,in_stack_fffffffffffff558);
      bVar2 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8);
      if (bVar2) {
        local_2cc = *(int *)(local_3a8 + (long)local_2c4 * 4);
        local_3a0 = (int *)(local_398 + (long)local_2cc * 4);
        local_388 = local_380 + local_2cc;
        for (local_2c8 = *(int *)(local_3a8 + (long)(local_2c4 + 1) * 4); local_2cc < local_2c8;
            local_2c8 = local_2c8 + -1) {
          local_2d0 = *local_3a0;
          local_e8 = local_6c8;
          local_f0 = &local_374;
          local_f8 = local_388;
          local_3a0 = local_3a0 + 1;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_f9,local_f0,local_388);
          local_e0 = local_6c8;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(in_R8);
          local_c8 = local_6c8;
          local_d0 = local_f0;
          local_d8 = local_f8;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (in_R8,in_stack_fffffffffffff558,(cpp_dec_float<100U,_int,_void> *)0x547054);
          updateSolutionVectorLright
                    (in_stack_fffffffffffff598,in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
                     in_stack_fffffffffffff580,in_stack_fffffffffffff578,in_RDI);
          local_388 = local_388 + 1;
        }
      }
    }
  }
  if (in_RDI[0x82] != 0) {
    local_2d4 = in_RDI[0x7c];
    for (; local_2c4 < local_2d4; local_2c4 = local_2c4 + 1) {
      local_2cc = *(int *)(local_3a8 + (long)local_2c4 * 4);
      local_3a0 = (int *)(local_398 + (long)local_2cc * 4);
      local_388 = local_380 + local_2cc;
      StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::StableSum((StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)in_R8);
      StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::StableSum((StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)in_R8);
      for (local_2c8 = *(int *)(local_3a8 + (long)(local_2c4 + 1) * 4); local_2cc < local_2c8;
          local_2c8 = local_2c8 + -1) {
        local_130 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)(local_2a0 + (long)*local_3a0 * 0x50);
        local_128 = local_7b8;
        local_138 = local_388;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_139,local_130,local_388);
        local_120 = local_7b8;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(in_R8);
        local_108 = local_7b8;
        local_110 = local_130;
        local_118 = local_138;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (in_R8,in_stack_fffffffffffff558,(cpp_dec_float<100U,_int,_void> *)0x547280);
        StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator+=((StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)in_R8,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)in_stack_fffffffffffff558);
        pnVar1 = local_388;
        local_170 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)(local_2c0 + (long)*local_3a0 * 0x50);
        local_168 = local_808;
        local_178 = local_388;
        local_3a0 = local_3a0 + 1;
        local_388 = local_388 + 1;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_179,local_170,pnVar1);
        local_160 = local_808;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(in_R8);
        local_148 = local_808;
        local_150 = local_170;
        local_158 = local_178;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (in_R8,in_stack_fffffffffffff558,(cpp_dec_float<100U,_int,_void> *)0x54737c);
        StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator+=((StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)in_R8,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)in_stack_fffffffffffff558);
      }
      StableSum::operator_cast_to_number
                ((StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_fffffffffffff558);
      local_1a8 = &local_324;
      local_1b0 = local_858;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                (in_R8,in_stack_fffffffffffff558);
      StableSum::operator_cast_to_number
                ((StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_fffffffffffff558);
      local_1b8 = &local_374;
      local_1c0 = local_8a8;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                (in_R8,in_stack_fffffffffffff558);
      local_2c8 = *(int *)(local_390 + (long)local_2c4 * 4);
      local_218 = local_8f8;
      local_220 = &local_324;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                (in_R8,in_stack_fffffffffffff558);
      local_208 = local_948;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                (in_R8,in_stack_fffffffffffff558);
      bVar2 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8);
      if (bVar2) {
        local_1f8 = local_998;
        local_200 = &local_324;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                  (in_R8,in_stack_fffffffffffff558);
        updateSolutionVectorLright
                  (in_stack_fffffffffffff598,in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
                   in_stack_fffffffffffff580,in_stack_fffffffffffff578,in_RDI);
      }
      local_1e8 = local_9e8;
      local_1f0 = &local_374;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                (in_R8,in_stack_fffffffffffff558);
      local_1d8 = local_a38;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                (in_R8,in_stack_fffffffffffff558);
      bVar2 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8);
      if (bVar2) {
        local_1c8 = &stack0xfffffffffffff578;
        local_1d0 = &local_374;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                  (in_R8,in_stack_fffffffffffff558);
        updateSolutionVectorLright
                  (in_stack_fffffffffffff598,in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
                   in_stack_fffffffffffff580,in_stack_fffffffffffff578,in_RDI);
      }
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveLright2(
   R* vec, int* ridx, int& rn, R eps,
   R* vec2, int* ridx2, int& rn2, R eps2)
{
   int i, j, k, n;
   int end;
   R x, x2;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   end = l.firstUpdate;

   // loop through columns of L
   for(i = 0; i < end; ++i)
   {
      j = lrow[i];
      x2 = vec2[j];
      x = vec[j];

      // check whether there is a corresponding value in the first rhs VectorBase<R>; skipping/ignoring FACTOR_MARKER
      if(isNotZero(x, eps))
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         // check whether there is  also a corresponding value in the second rhs VectorBase<R>; skipping/ignoring FACTOR_MARKER
         if(isNotZero(x2, eps2))
         {
            for(j = lbeg[i + 1]; j > k; --j)
            {
               assert(*idx >= 0 && *idx < thedim);
               n = *idx++;
               updateSolutionVectorLright(x * (*val), n, vec[n], ridx, rn);
               updateSolutionVectorLright(x2 * (*val), n, vec2[n], ridx2, rn2);
               ++val;
            }
         }
         // only the first VectorBase<R> needs to be modified
         else
         {
            for(j = lbeg[i + 1]; j > k; --j)
            {
               assert(*idx >= 0 && *idx < thedim);
               n = *idx++;
               updateSolutionVectorLright(x * (*val), n, vec[n], ridx, rn);
               ++val;
            }
         }
      }
      // only the second VectorBase<R> needs to be modified
      else if(isNotZero(x2, eps2))
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         for(j = lbeg[i + 1]; j > k; --j)
         {
            assert(*idx >= 0 && *idx < thedim);
            n = *idx++;
            updateSolutionVectorLright(x2 * (*val), n, vec2[n], ridx2, rn2);
            ++val;
         }
      }
   }

   if(l.updateType)                     /* Forest-Tomlin Updates */
   {
      end = l.firstUnused;

      for(; i < end; ++i)
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         StableSum<R> tmp1, tmp2;

         for(j = lbeg[i + 1]; j > k; --j)
         {
            assert(*idx >= 0 && *idx < thedim);
            tmp1 += vec[*idx] * (*val);
            tmp2 += vec2[*idx++] * (*val++);
         }

         x = R(tmp1);
         x2 = R(tmp2);

         j = lrow[i];

         if(isNotZero(x, eps))
            updateSolutionVectorLright(x, j, vec[j], ridx, rn);

         if(isNotZero(x2, eps2))
            updateSolutionVectorLright(x2, j, vec2[j], ridx2, rn2);
      }
   }
}